

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O2

bool __thiscall DiskInterface::MakeDirs(DiskInterface *this,string *path)

{
  bool bVar1;
  undefined1 uVar2;
  long lVar3;
  char *pcVar4;
  string dir;
  string err;
  
  lVar3 = std::__cxx11::string::find_last_of((char *)path,0x11c0e7);
  if (lVar3 == -1) {
    dir._M_dataplus._M_p = (pointer)&dir.field_2;
    dir._M_string_length = 0;
    dir.field_2._M_local_buf[0] = '\0';
  }
  else {
    do {
      if (lVar3 == 0) break;
      pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (&(anonymous_namespace)::DirName(std::__cxx11::string_const&)::
                           kPathSeparators,0x11c0e8,(path->_M_dataplus)._M_p + lVar3 + -1);
      lVar3 = lVar3 + -1;
    } while (pcVar4 != (char *)((long)&(anonymous_namespace)::DirName(std::__cxx11::string_const&)::
                                       kPathSeparators + 1));
    std::__cxx11::string::substr((ulong)&dir,(ulong)path);
    if (dir._M_string_length != 0) {
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_local_buf[0] = '\0';
      lVar3 = (**(code **)(*(long *)this + 0x18))(this,&dir,&err);
      if (lVar3 < 0) {
        uVar2 = 0;
        Error("%s",err._M_dataplus._M_p);
      }
      else {
        uVar2 = 1;
        if (lVar3 == 0) {
          bVar1 = MakeDirs(this,&dir);
          if (bVar1) {
            uVar2 = (**(code **)(*(long *)this + 0x20))(this,&dir);
          }
          else {
            uVar2 = 0;
          }
        }
      }
      std::__cxx11::string::~string((string *)&err);
      goto LAB_0010f67a;
    }
  }
  uVar2 = 1;
LAB_0010f67a:
  std::__cxx11::string::~string((string *)&dir);
  return (bool)uVar2;
}

Assistant:

bool DiskInterface::MakeDirs(const string& path) {
  string dir = DirName(path);
  if (dir.empty())
    return true;  // Reached root; assume it's there.
  string err;
  TimeStamp mtime = Stat(dir, &err);
  if (mtime < 0) {
    Error("%s", err.c_str());
    return false;
  }
  if (mtime > 0)
    return true;  // Exists already; we're done.

  // Directory doesn't exist.  Try creating its parent first.
  bool success = MakeDirs(dir);
  if (!success)
    return false;
  return MakeDir(dir);
}